

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::MultiPartInputFile::MultiPartInputFile
          (MultiPartInputFile *this,IStream *is,int numThreads,bool reconstructChunkOffsetTable)

{
  Data *pDVar1;
  _Rb_tree_header *p_Var2;
  stringstream _iex_replace_s;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__MultiPartInputFile_00380930;
  pDVar1 = (Data *)operator_new(0xa8);
  (pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (pDVar1->super_InputStreamMutex).is = (IStream *)0x0;
  *(undefined8 *)
   ((long)&(pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pDVar1->super_InputStreamMutex).super_Mutex.super___mutex_base._M_mutex + 8) = 0;
  (pDVar1->super_InputStreamMutex).currentPosition = 0;
  pDVar1->deleteStream = false;
  (pDVar1->parts).
  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->parts).
  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->parts).
  super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1->numThreads = numThreads;
  pDVar1->reconstructChunkOffsetTable = reconstructChunkOffsetTable;
  p_Var2 = &(pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pDVar1->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pDVar1->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->_headers).super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_data = pDVar1;
  (pDVar1->super_InputStreamMutex).is = is;
  initialize(this);
  return;
}

Assistant:

MultiPartInputFile::MultiPartInputFile (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is,
                                        int numThreads,
                                        bool reconstructChunkOffsetTable):
    _data(new Data(false, numThreads, reconstructChunkOffsetTable))
{
    try
    {
        _data->is = &is;
        initialize();
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        delete _data;

        REPLACE_EXC (e, "Cannot read image file "
                     "\"" << is.fileName() << "\". " << e.what());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}